

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O0

bool __thiscall
re2::DFA::InlinedSearchLoop
          (DFA *this,SearchParams *params,bool have_firstbyte,bool want_earliest_match,
          bool run_forward)

{
  byte bVar1;
  byte bVar2;
  vector<int,_std::allocator<int>_> *this_00;
  bool bVar3;
  int iVar4;
  InstOp IVar5;
  iterator pcVar6;
  uint8 *puVar7;
  void *pvVar8;
  uint8 *puVar9;
  ulong uVar10;
  size_type sVar11;
  iterator pcVar12;
  byte *pbVar13;
  State *pSVar14;
  ostream *poVar15;
  int local_434;
  Inst *local_430;
  Inst *ip;
  vector<int,_std::allocator<int>_> *pvStack_420;
  int i;
  vector<int,_std::allocator<int>_> *v;
  undefined1 local_298 [8];
  StateSaver save_s_1;
  State *ns;
  undefined1 local_260 [4];
  int lastbyte;
  int local_e0;
  undefined1 local_d0 [8];
  StateSaver save_s;
  StateSaver save_start;
  State *ns_1;
  State *pSStack_70;
  int c;
  State *s;
  uint8 *puStack_60;
  bool matched;
  uint8 *lastmatch;
  uint8 *bytemap;
  uint8 *resetp;
  uint8 *ep;
  uint8 *p;
  uint8 *bp;
  State *start;
  bool run_forward_local;
  bool want_earliest_match_local;
  SearchParams *pSStack_20;
  bool have_firstbyte_local;
  SearchParams *params_local;
  DFA *this_local;
  
  bp = (uint8 *)params->start;
  start._5_1_ = run_forward;
  start._6_1_ = want_earliest_match;
  start._7_1_ = have_firstbyte;
  pSStack_20 = params;
  params_local = (SearchParams *)this;
  pcVar6 = StringPiece::begin(&params->text);
  ep = BytePtr(pcVar6);
  p = ep;
  pcVar6 = StringPiece::end(&pSStack_20->text);
  resetp = BytePtr(pcVar6);
  bytemap = (uint8 *)0x0;
  if ((start._5_1_ & 1) == 0) {
    std::swap<unsigned_char_const*>(&ep,&resetp);
  }
  puVar7 = Prog::bytemap(this->prog_);
  puStack_60 = (uint8 *)0x0;
  bVar2 = 0;
  pSStack_70 = (State *)bp;
  bVar3 = State::IsMatch((State *)bp);
  if (bVar3) {
    bVar2 = 1;
    puStack_60 = ep;
    if ((start._6_1_ & 1) != 0) {
      pSStack_20->ep = (char *)ep;
      this_local._7_1_ = 1;
      goto LAB_001682e6;
    }
  }
  do {
    do {
      if (ep == resetp) goto LAB_00167edf;
      if (((start._7_1_ & 1) != 0) && (pSStack_70 == (State *)bp)) {
        if ((start._5_1_ & 1) == 0) {
          pvVar8 = memrchr(resetp,pSStack_20->firstbyte,(long)ep - (long)resetp);
          puVar9 = BytePtr(pvVar8);
          if (puVar9 != (uint8 *)0x0) {
            ep = puVar9 + 1;
            goto LAB_00167b7c;
          }
          ep = resetp;
        }
        else {
          pvVar8 = memchr(ep,pSStack_20->firstbyte,(long)resetp - (long)ep);
          ep = BytePtr(pvVar8);
          if (ep != (uint8 *)0x0) goto LAB_00167b7c;
          ep = resetp;
        }
LAB_00167edf:
        if ((start._5_1_ & 1) == 0) {
          pcVar6 = StringPiece::begin(&pSStack_20->text);
          pcVar12 = StringPiece::begin(&pSStack_20->context);
          if (pcVar6 == pcVar12) {
            ns._4_4_ = 0x100;
          }
          else {
            pcVar6 = StringPiece::begin(&pSStack_20->text);
            ns._4_4_ = (uint)(byte)pcVar6[-1];
          }
        }
        else {
          pcVar6 = StringPiece::end(&pSStack_20->text);
          pcVar12 = StringPiece::end(&pSStack_20->context);
          if (pcVar6 == pcVar12) {
            ns._4_4_ = 0x100;
          }
          else {
            pbVar13 = (byte *)StringPiece::end(&pSStack_20->text);
            ns._4_4_ = (uint)*pbVar13;
          }
        }
        iVar4 = ByteMap(this,ns._4_4_);
        save_s_1.special_ =
             std::atomic<re2::DFA::State_*>::load
                       ((atomic<re2::DFA::State_*> *)(&pSStack_70[1].inst_ + iVar4),
                        memory_order_acquire);
        if ((save_s_1.special_ == (__pointer_type)0x0) &&
           (save_s_1.special_ = RunStateOnByteUnlocked(this,pSStack_70,ns._4_4_),
           save_s_1.special_ == (State *)0x0)) {
          StateSaver::StateSaver((StateSaver *)local_298,this,pSStack_70);
          ResetCache(this,pSStack_20->cache_lock);
          pSVar14 = StateSaver::Restore((StateSaver *)local_298);
          if (pSVar14 == (State *)0x0) {
            pSStack_20->failed = true;
            this_local._7_1_ = 0;
            local_e0 = 1;
          }
          else {
            save_s_1.special_ = RunStateOnByteUnlocked(this,pSVar14,ns._4_4_);
            if (save_s_1.special_ == (State *)0x0) {
              LogMessageFatal::LogMessageFatal
                        ((LogMessageFatal *)&v,
                         "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                         ,0x5ce);
              poVar15 = LogMessage::stream((LogMessage *)&v);
              std::operator<<(poVar15,"RunStateOnByteUnlocked failed after Reset");
              LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&v);
              pSStack_20->failed = true;
              this_local._7_1_ = 0;
              local_e0 = 1;
            }
            else {
              local_e0 = 0;
            }
          }
          StateSaver::~StateSaver((StateSaver *)local_298);
          if (local_e0 != 0) goto LAB_001682e6;
        }
        pSVar14 = save_s_1.special_;
        if (save_s_1.special_ == (State *)0x2) {
          pSStack_20->ep = (char *)resetp;
          this_local._7_1_ = 1;
        }
        else {
          if (((State *)0x2 < save_s_1.special_) &&
             (bVar3 = State::IsMatch(save_s_1.special_), bVar3)) {
            bVar2 = 1;
            puStack_60 = ep;
            if ((pSStack_20->matches != (vector<int,_std::allocator<int>_> *)0x0) &&
               (this->kind_ == kManyMatch)) {
              pvStack_420 = pSStack_20->matches;
              std::vector<int,_std::allocator<int>_>::clear(pvStack_420);
              for (ip._4_4_ = 0; ip._4_4_ < pSVar14->ninst_; ip._4_4_ = ip._4_4_ + 1) {
                local_430 = Prog::inst(this->prog_,pSVar14->inst_[ip._4_4_]);
                while( true ) {
                  IVar5 = Prog::Inst::opcode(local_430);
                  this_00 = pvStack_420;
                  if (IVar5 == kInstMatch) {
                    local_434 = Prog::Inst::match_id(local_430);
                    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_434);
                  }
                  iVar4 = Prog::Inst::last(local_430);
                  if (iVar4 != 0) break;
                  local_430 = local_430 + 1;
                }
              }
            }
          }
          pSStack_20->ep = (char *)puStack_60;
          this_local._7_1_ = bVar2;
        }
        goto LAB_001682e6;
      }
LAB_00167b7c:
      if ((start._5_1_ & 1) == 0) {
        bVar1 = ep[-1];
        ep = ep + -1;
      }
      else {
        bVar1 = *ep;
        ep = ep + 1;
      }
      ns_1._4_4_ = (uint)bVar1;
      save_start.special_ =
           std::atomic<re2::DFA::State_*>::load
                     ((atomic<re2::DFA::State_*> *)(&pSStack_70[1].inst_ + puVar7[(int)ns_1._4_4_]),
                      memory_order_acquire);
      if ((save_start.special_ == (__pointer_type)0x0) &&
         (save_start.special_ = RunStateOnByteUnlocked(this,pSStack_70,ns_1._4_4_),
         save_start.special_ == (State *)0x0)) {
        if (((FLAGS_re2_dfa_bail_when_slow & 1) != 0) &&
           ((bytemap != (uint8 *)0x0 &&
            (uVar10 = (long)ep - (long)bytemap,
            sVar11 = std::
                     unordered_set<re2::DFA::State_*,_re2::DFA::StateHash,_re2::DFA::StateEqual,_std::allocator<re2::DFA::State_*>_>
                     ::size(&this->state_cache_), uVar10 < sVar11 * 10)))) {
          pSStack_20->failed = true;
          this_local._7_1_ = 0;
          goto LAB_001682e6;
        }
        bytemap = ep;
        StateSaver::StateSaver((StateSaver *)&save_s.special_,this,(State *)bp);
        StateSaver::StateSaver((StateSaver *)local_d0,this,pSStack_70);
        ResetCache(this,pSStack_20->cache_lock);
        bp = (uint8 *)StateSaver::Restore((StateSaver *)&save_s.special_);
        if (((State *)bp == (State *)0x0) ||
           (pSVar14 = StateSaver::Restore((StateSaver *)local_d0), pSVar14 == (State *)0x0)) {
          pSStack_20->failed = true;
          this_local._7_1_ = 0;
          local_e0 = 1;
        }
        else {
          save_start.special_ = RunStateOnByteUnlocked(this,pSVar14,ns_1._4_4_);
          if (save_start.special_ == (State *)0x0) {
            LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)local_260,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc"
                       ,0x58e);
            poVar15 = LogMessage::stream((LogMessage *)local_260);
            std::operator<<(poVar15,"RunStateOnByteUnlocked failed after ResetCache");
            LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_260);
            pSStack_20->failed = true;
            this_local._7_1_ = 0;
            local_e0 = 1;
          }
          else {
            local_e0 = 0;
          }
        }
        StateSaver::~StateSaver((StateSaver *)local_d0);
        StateSaver::~StateSaver((StateSaver *)&save_s.special_);
        if (local_e0 != 0) goto LAB_001682e6;
      }
      if (save_start.special_ < (State *)0x3) {
        if (save_start.special_ == (State *)0x1) {
          pSStack_20->ep = (char *)puStack_60;
          this_local._7_1_ = bVar2;
        }
        else {
          pSStack_20->ep = (char *)resetp;
          this_local._7_1_ = 1;
        }
        goto LAB_001682e6;
      }
      pSStack_70 = save_start.special_;
      bVar3 = State::IsMatch(save_start.special_);
    } while (!bVar3);
    bVar2 = 1;
    if ((start._5_1_ & 1) == 0) {
      puStack_60 = ep + 1;
    }
    else {
      puStack_60 = ep + -1;
    }
  } while ((start._6_1_ & 1) == 0);
  pSStack_20->ep = (char *)puStack_60;
  this_local._7_1_ = 1;
LAB_001682e6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool DFA::InlinedSearchLoop(SearchParams* params,
                                   bool have_firstbyte,
                                   bool want_earliest_match,
                                   bool run_forward) {
  State* start = params->start;
  const uint8* bp = BytePtr(params->text.begin());  // start of text
  const uint8* p = bp;                              // text scanning point
  const uint8* ep = BytePtr(params->text.end());    // end of text
  const uint8* resetp = NULL;                       // p at last cache reset
  if (!run_forward)
    swap(p, ep);

  const uint8* bytemap = prog_->bytemap();
  const uint8* lastmatch = NULL;   // most recent matching position in text
  bool matched = false;
  State* s = start;

  if (s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (want_earliest_match) {
      params->ep = reinterpret_cast<const char*>(lastmatch);
      return true;
    }
  }

  while (p != ep) {
    if (DebugDFA)
      fprintf(stderr, "@%d: %s\n", static_cast<int>(p - bp),
              DumpState(s).c_str());
    if (have_firstbyte && s == start) {
      // In start state, only way out is to find firstbyte,
      // so use optimized assembly in memchr to skip ahead.
      // If firstbyte isn't found, we can skip to the end
      // of the string.
      if (run_forward) {
        if ((p = BytePtr(memchr(p, params->firstbyte, ep - p))) == NULL) {
          p = ep;
          break;
        }
      } else {
        if ((p = BytePtr(memrchr(ep, params->firstbyte, p - ep))) == NULL) {
          p = ep;
          break;
        }
        p++;
      }
    }

    int c;
    if (run_forward)
      c = *p++;
    else
      c = *--p;

    // Note that multiple threads might be consulting
    // s->next_[bytemap[c]] simultaneously.
    // RunStateOnByte takes care of the appropriate locking,
    // including a memory barrier so that the unlocked access
    // (sometimes known as "double-checked locking") is safe.
    // The alternative would be either one DFA per thread
    // or one mutex operation per input byte.
    //
    // ns == DeadState means the state is known to be dead
    // (no more matches are possible).
    // ns == NULL means the state has not yet been computed
    // (need to call RunStateOnByteUnlocked).
    // RunStateOnByte returns ns == NULL if it is out of memory.
    // ns == FullMatchState means the rest of the string matches.
    //
    // Okay to use bytemap[] not ByteMap() here, because
    // c is known to be an actual byte and not kByteEndText.

    State* ns = s->next_[bytemap[c]].load(std::memory_order_acquire);
    if (ns == NULL) {
      ns = RunStateOnByteUnlocked(s, c);
      if (ns == NULL) {
        // After we reset the cache, we hold cache_mutex exclusively,
        // so if resetp != NULL, it means we filled the DFA state
        // cache with this search alone (without any other threads).
        // Benchmarks show that doing a state computation on every
        // byte runs at about 0.2 MB/s, while the NFA (nfa.cc) can do the
        // same at about 2 MB/s.  Unless we're processing an average
        // of 10 bytes per state computation, fail so that RE2 can
        // fall back to the NFA.
        if (FLAGS_re2_dfa_bail_when_slow && resetp != NULL &&
            static_cast<unsigned long>(p - resetp) < 10*state_cache_.size()) {
          params->failed = true;
          return false;
        }
        resetp = p;

        // Prepare to save start and s across the reset.
        StateSaver save_start(this, start);
        StateSaver save_s(this, s);

        // Discard all the States in the cache.
        ResetCache(params->cache_lock);

        // Restore start and s so we can continue.
        if ((start = save_start.Restore()) == NULL ||
            (s = save_s.Restore()) == NULL) {
          // Restore already did LOG(DFATAL).
          params->failed = true;
          return false;
        }
        ns = RunStateOnByteUnlocked(s, c);
        if (ns == NULL) {
          LOG(DFATAL) << "RunStateOnByteUnlocked failed after ResetCache";
          params->failed = true;
          return false;
        }
      }
    }
    if (ns <= SpecialStateMax) {
      if (ns == DeadState) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return matched;
      }
      // FullMatchState
      params->ep = reinterpret_cast<const char*>(ep);
      return true;
    }
    s = ns;

    if (s->IsMatch()) {
      matched = true;
      // The DFA notices the match one byte late,
      // so adjust p before using it in the match.
      if (run_forward)
        lastmatch = p - 1;
      else
        lastmatch = p + 1;
      if (DebugDFA)
        fprintf(stderr, "match @%d! [%s]\n",
                static_cast<int>(lastmatch - bp),
                DumpState(s).c_str());

      if (want_earliest_match) {
        params->ep = reinterpret_cast<const char*>(lastmatch);
        return true;
      }
    }
  }

  // Process one more byte to see if it triggers a match.
  // (Remember, matches are delayed one byte.)
  int lastbyte;
  if (run_forward) {
    if (params->text.end() == params->context.end())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.end()[0] & 0xFF;
  } else {
    if (params->text.begin() == params->context.begin())
      lastbyte = kByteEndText;
    else
      lastbyte = params->text.begin()[-1] & 0xFF;
  }

  State* ns = s->next_[ByteMap(lastbyte)].load(std::memory_order_acquire);
  if (ns == NULL) {
    ns = RunStateOnByteUnlocked(s, lastbyte);
    if (ns == NULL) {
      StateSaver save_s(this, s);
      ResetCache(params->cache_lock);
      if ((s = save_s.Restore()) == NULL) {
        params->failed = true;
        return false;
      }
      ns = RunStateOnByteUnlocked(s, lastbyte);
      if (ns == NULL) {
        LOG(DFATAL) << "RunStateOnByteUnlocked failed after Reset";
        params->failed = true;
        return false;
      }
    }
  }
  s = ns;
  if (DebugDFA)
    fprintf(stderr, "@_: %s\n", DumpState(s).c_str());
  if (s == FullMatchState) {
    params->ep = reinterpret_cast<const char*>(ep);
    return true;
  }
  if (s > SpecialStateMax && s->IsMatch()) {
    matched = true;
    lastmatch = p;
    if (params->matches && kind_ == Prog::kManyMatch) {
      vector<int>* v = params->matches;
      v->clear();
      for (int i = 0; i < s->ninst_; i++) {
        Prog::Inst* ip = prog_->inst(s->inst_[i]);
        for (;;) {
          if (ip->opcode() == kInstMatch)
            v->push_back(ip->match_id());
          if (ip->last())
            break;
          ip++;
        }
      }
    }
    if (DebugDFA)
      fprintf(stderr, "match @%d! [%s]\n", static_cast<int>(lastmatch - bp),
              DumpState(s).c_str());
  }
  params->ep = reinterpret_cast<const char*>(lastmatch);
  return matched;
}